

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImVec2 frame_padding,
               char *label,ImGuiID tab_id,ImGuiID close_button_id,bool is_contents_visible,
               bool *out_just_closed,bool *out_text_clipped)

{
  ImVec2 IVar1;
  undefined8 uVar2;
  ImVec2 IVar3;
  ImGuiContext_conflict1 *pIVar4;
  bool bVar5;
  _Bool _Var6;
  ImU32 col;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float clip_max_x;
  ImVec2 button_pos;
  ImVec2 label_size;
  ImGuiLastItemData last_item_backup;
  float local_c8;
  float fStack_c4;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  char *local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined4 uStack_60;
  float local_5c;
  float fStack_58;
  ImVec2 IStack_54;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pIVar4 = GImGui;
  local_a0 = label;
  local_90 = frame_padding;
  local_98 = CalcTextSize(label,(char *)0x0,true,-1.0);
  if (out_just_closed != (bool *)0x0) {
    *out_just_closed = false;
  }
  if (out_text_clipped != (bool *)0x0) {
    *out_text_clipped = false;
  }
  fVar9 = (bb->Min).x;
  fVar8 = (bb->Max).x;
  if (fVar8 - fVar9 <= 1.0) {
    return;
  }
  local_a8.y = (bb->Min).y;
  local_b0.y = (bb->Max).y;
  local_c8 = frame_padding.x;
  fStack_c4 = frame_padding.y;
  clip_max_x = fVar8 - local_c8;
  local_b8.y = local_a8.y + fStack_c4;
  local_b8.x = fVar9 + local_c8;
  if (out_text_clipped != (bool *)0x0) {
    *out_text_clipped = clip_max_x < fVar9 + local_c8 + local_98.x;
  }
  fVar10 = pIVar4->FontSize;
  fVar11 = (fVar8 - (local_c8 + local_c8)) - fVar10;
  uVar7 = -(uint)(fVar11 <= fVar9);
  local_a8.x = (float)(uVar7 & (uint)fVar9 | ~uVar7 & (uint)fVar11);
  local_b0.x = clip_max_x;
  if (((close_button_id == 0) ||
      ((!is_contents_visible &&
       (fVar11 = (pIVar4->Style).TabMinWidthForCloseButton, uVar7 = -(uint)(fVar11 <= fVar10),
       fVar8 - fVar9 < (float)(~uVar7 & (uint)fVar11 | uVar7 & (uint)fVar10))))) ||
     ((pIVar4->HoveredId != close_button_id && pIVar4->HoveredId != tab_id &&
      (pIVar4->ActiveId != tab_id && pIVar4->ActiveId != close_button_id)))) {
    fVar9 = (bb->Max).x;
    if (((flags & 1U) == 0) || (fVar9 < fVar10 + local_a8.x)) {
      fVar10 = fVar9 + -1.0;
      bVar5 = false;
      goto LAB_002323ca;
    }
    IVar1 = (pIVar4->Style).FramePadding;
    fVar9 = IVar1.x;
    fVar8 = IVar1.y;
    local_48 = (fVar10 + local_a8.x + fVar9 + fVar9 + local_a8.x) * 0.5;
    fStack_44 = (local_a8.y + fVar10 + fVar8 + fVar8 + local_a8.y) * 0.5;
    uStack_40 = 0;
    uStack_3c = 0;
    bVar5 = false;
    col = GetColorU32(0,1.0);
    IVar1.y = fStack_44;
    IVar1.x = local_48;
    RenderBullet(draw_list,IVar1,col);
    fVar10 = fVar10 * 0.8;
    local_b0.x = fVar10;
  }
  else {
    fVar8 = local_a8.x + fVar10;
    fVar9 = (bb->Max).x;
    local_88._0_4_ = (pIVar4->LastItemData).ID;
    local_88._4_4_ = (pIVar4->LastItemData).InFlags;
    uStack_80._0_4_ = (pIVar4->LastItemData).StatusFlags;
    uStack_80._4_4_ = (pIVar4->LastItemData).Rect.Min.x;
    local_78 = *(undefined8 *)&(pIVar4->LastItemData).Rect.Min.y;
    uStack_70 = *(undefined8 *)&(pIVar4->LastItemData).Rect.Max.y;
    uStack_68 = *(undefined8 *)&(pIVar4->LastItemData).NavRect.Min.y;
    uVar2 = *(undefined8 *)&(pIVar4->LastItemData).NavRect.Max.y;
    IStack_54 = (pIVar4->LastItemData).DisplayRect.Max;
    fStack_58 = (pIVar4->LastItemData).DisplayRect.Min.y;
    uStack_60 = (undefined4)uVar2;
    local_5c = (float)((ulong)uVar2 >> 0x20);
    PushStyleVar(0xb,&local_90);
    bVar5 = CloseButton(close_button_id,&local_a8);
    PopStyleVar(1);
    IVar3.y = fStack_58;
    IVar3.x = local_5c;
    (pIVar4->LastItemData).DisplayRect.Min = IVar3;
    (pIVar4->LastItemData).DisplayRect.Max = IStack_54;
    *(undefined8 *)&(pIVar4->LastItemData).NavRect.Min.y = uStack_68;
    *(ulong *)&(pIVar4->LastItemData).NavRect.Max.y = CONCAT44(local_5c,uStack_60);
    *(undefined8 *)&(pIVar4->LastItemData).Rect.Min.y = local_78;
    *(undefined8 *)&(pIVar4->LastItemData).Rect.Max.y = uStack_70;
    (pIVar4->LastItemData).ID = (undefined4)local_88;
    (pIVar4->LastItemData).InFlags = local_88._4_4_;
    (pIVar4->LastItemData).StatusFlags = (undefined4)uStack_80;
    (pIVar4->LastItemData).Rect.Min.x = (float)uStack_80._4_4_;
    if (((flags & 4U) == 0) && (_Var6 = IsMouseClicked(2,false), _Var6)) {
      bVar5 = true;
    }
    if ((fVar8 <= fVar9 & (byte)flags) == 0) {
      local_b0.x = 0.0;
    }
    else {
      local_b0.x = fVar10 * 0.8;
    }
  }
  fVar10 = clip_max_x - fVar10;
  local_b0.x = clip_max_x - local_b0.x;
  clip_max_x = fVar10;
LAB_002323ca:
  RenderTextEllipsis(draw_list,&local_b8,&local_b0,clip_max_x,fVar10,local_a0,(char *)0x0,&local_98)
  ;
  if (out_just_closed != (bool *)0x0) {
    *out_just_closed = bVar5;
  }
  return;
}

Assistant:

void ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImVec2 frame_padding, const char* label, ImGuiID tab_id, ImGuiID close_button_id, bool is_contents_visible, bool* out_just_closed, bool* out_text_clipped)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);

    if (out_just_closed)
        *out_just_closed = false;
    if (out_text_clipped)
        *out_text_clipped = false;

    if (bb.GetWidth() <= 1.0f)
        return;

    // In Style V2 we'll have full override of all colors per state (e.g. focused, selected)
    // But right now if you want to alter text color of tabs this is what you need to do.
#if 0
    const float backup_alpha = g.Style.Alpha;
    if (!is_contents_visible)
        g.Style.Alpha *= 0.7f;
#endif

    // Render text label (with clipping + alpha gradient) + unsaved marker
    ImRect text_pixel_clip_bb(bb.Min.x + frame_padding.x, bb.Min.y + frame_padding.y, bb.Max.x - frame_padding.x, bb.Max.y);
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Return clipped state ignoring the close button
    if (out_text_clipped)
    {
        *out_text_clipped = (text_ellipsis_clip_bb.Min.x + label_size.x) > text_pixel_clip_bb.Max.x;
        //draw_list->AddCircle(text_ellipsis_clip_bb.Min, 3.0f, *out_text_clipped ? IM_COL32(255, 0, 0, 255) : IM_COL32(0, 255, 0, 255));
    }

    const float button_sz = g.FontSize;
    const ImVec2 button_pos(ImMax(bb.Min.x, bb.Max.x - frame_padding.x * 2.0f - button_sz), bb.Min.y);

    // Close Button & Unsaved Marker
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (is_contents_visible || bb.GetWidth() >= ImMax(button_sz, g.Style.TabMinWidthForCloseButton))
            if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == tab_id || g.ActiveId == close_button_id)
                close_button_visible = true;
    bool unsaved_marker_visible = (flags & ImGuiTabItemFlags_UnsavedDocument) != 0 && (button_pos.x + button_sz <= bb.Max.x);

    if (close_button_visible)
    {
        ImGuiLastItemData last_item_backup = g.LastItemData;
        PushStyleVar(ImGuiStyleVar_FramePadding, frame_padding);
        if (CloseButton(close_button_id, button_pos))
            close_button_pressed = true;
        PopStyleVar();
        g.LastItemData = last_item_backup;

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;
    }
    else if (unsaved_marker_visible)
    {
        const ImRect bullet_bb(button_pos, button_pos + ImVec2(button_sz, button_sz) + g.Style.FramePadding * 2.0f);
        RenderBullet(draw_list, bullet_bb.GetCenter(), GetColorU32(ImGuiCol_Text));
    }

    // This is all rather complicated
    // (the main idea is that because the close button only appears on hover, we don't want it to alter the ellipsis position)
    // FIXME: if FramePadding is noticeably large, ellipsis_max_x will be wrong here (e.g. #3497), maybe for consistency that parameter of RenderTextEllipsis() shouldn't exist..
    float ellipsis_max_x = close_button_visible ? text_pixel_clip_bb.Max.x : bb.Max.x - 1.0f;
    if (close_button_visible || unsaved_marker_visible)
    {
        text_pixel_clip_bb.Max.x -= close_button_visible ? (button_sz) : (button_sz * 0.80f);
        text_ellipsis_clip_bb.Max.x -= unsaved_marker_visible ? (button_sz * 0.80f) : 0.0f;
        ellipsis_max_x = text_pixel_clip_bb.Max.x;
    }
    RenderTextEllipsis(draw_list, text_ellipsis_clip_bb.Min, text_ellipsis_clip_bb.Max, text_pixel_clip_bb.Max.x, ellipsis_max_x, label, NULL, &label_size);

#if 0
    if (!is_contents_visible)
        g.Style.Alpha = backup_alpha;
#endif

    if (out_just_closed)
        *out_just_closed = close_button_pressed;
}